

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::LexXEqual(Lexer *this,TokenDetail *detail,int equal_token)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  Lexer *in_RDI;
  int next;
  int token;
  int local_4;
  
  local_4 = in_RDI->current_;
  iVar1 = Next(in_RDI);
  if (iVar1 == 0x3d) {
    iVar1 = Next(in_RDI);
    in_RDI->current_ = iVar1;
    *(int *)(in_RSI + 0x18) = in_EDX;
    *(int *)(in_RSI + 0x10) = in_RDI->line_;
    *(int *)(in_RSI + 0x14) = in_RDI->column_;
    *(String **)(in_RSI + 8) = in_RDI->module_;
    local_4 = in_EDX;
  }
  else {
    in_RDI->current_ = iVar1;
    *(int *)(in_RSI + 0x18) = local_4;
    *(int *)(in_RSI + 0x10) = in_RDI->line_;
    *(int *)(in_RSI + 0x14) = in_RDI->column_;
    *(String **)(in_RSI + 8) = in_RDI->module_;
  }
  return local_4;
}

Assistant:

int Lexer::LexXEqual(TokenDetail *detail, int equal_token)
    {
        int token = current_;

        int next = Next();
        if (next == '=')
        {
            current_ = Next();
            RETURN_NORMAL_TOKEN_DETAIL(detail, equal_token);
        }
        else
        {
            current_ = next;
            RETURN_NORMAL_TOKEN_DETAIL(detail, token);
        }
    }